

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServerKeepAlive.cpp
# Opt level: O2

void __thiscall
ki::protocol::control::ServerKeepAlive::write_to(ServerKeepAlive *this,ostream *ostream)

{
  Field<int> *pFVar1;
  allocator local_a1;
  string local_a0;
  string local_80;
  Record record;
  
  ki::dml::Record::Record(&record);
  std::__cxx11::string::string((string *)&local_80,"m_session_id",&local_a1);
  ki::dml::Record::add_field<unsigned_short>(&record,&local_80,true);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::string((string *)&local_a0,"m_timestamp",&local_a1);
  pFVar1 = ki::dml::Record::add_field<int>(&record,&local_a0,true);
  pFVar1->m_value = this->m_timestamp;
  std::__cxx11::string::~string((string *)&local_a0);
  ki::dml::Record::write_to(&record,ostream);
  ki::dml::Record::~Record(&record);
  return;
}

Assistant:

void ServerKeepAlive::write_to(std::ostream& ostream) const
	{
		dml::Record record;
		record.add_field<dml::USHRT>("m_session_id");
		record.add_field<dml::INT>("m_timestamp")->set_value(m_timestamp);
		record.write_to(ostream);
	}